

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlErrorPtrWrap(xmlError *error)

{
  void *__s;
  xmlErrorPtr copy;
  PyObject *ret;
  xmlError *error_local;
  
  if (error == (xmlError *)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    error_local = (xmlError *)&_Py_NoneStruct;
  }
  else {
    __s = (void *)(*_xmlMalloc)(0x58);
    if (__s == (void *)0x0) {
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      error_local = (xmlError *)&_Py_NoneStruct;
    }
    else {
      memset(__s,0,0x58);
      xmlCopyError(error,__s);
      error_local = (xmlError *)PyCapsule_New(__s,"xmlErrorPtr",libxml_xmlDestructError);
    }
  }
  return (PyObject *)error_local;
}

Assistant:

PyObject *
libxml_xmlErrorPtrWrap(const xmlError *error)
{
    PyObject *ret;
    xmlErrorPtr copy;

    if (error == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    copy = xmlMalloc(sizeof(*copy));
    if (copy == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    memset(copy, 0, sizeof(*copy));
    xmlCopyError(error, copy);
    ret = PyCapsule_New(copy, "xmlErrorPtr", libxml_xmlDestructError);
    return (ret);
}